

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

EffectiveSign __thiscall
slang::ast::ConditionalExpression::getEffectiveSignImpl
          (ConditionalExpression *this,bool isForConversion)

{
  EffectiveSign left;
  EffectiveSign right;
  Expression *pEVar1;
  ConditionalExpression *in_RDI;
  Expression *branch;
  undefined1 in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  pEVar1 = knownSide(in_RDI);
  if (pEVar1 == (Expression *)0x0) {
    ConditionalExpression::left(in_RDI);
    left = Expression::getEffectiveSign
                     ((Expression *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (bool)in_stack_ffffffffffffffcf);
    ConditionalExpression::right(in_RDI);
    right = Expression::getEffectiveSign
                      ((Expression *)CONCAT44(left,in_stack_ffffffffffffffd0),
                       (bool)in_stack_ffffffffffffffcf);
    local_4 = Expression::conjunction(left,right);
  }
  else {
    local_4 = Expression::getEffectiveSign
                        ((Expression *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,(bool)in_stack_ffffffffffffffcf);
  }
  return local_4;
}

Assistant:

Expression::EffectiveSign ConditionalExpression::getEffectiveSignImpl(bool isForConversion) const {
    if (auto branch = knownSide())
        return branch->getEffectiveSign(isForConversion);
    return conjunction(left().getEffectiveSign(isForConversion),
                       right().getEffectiveSign(isForConversion));
}